

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O0

Status __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getRedCostSol(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *p_vector)

{
  bool bVar1;
  Representation RVar2;
  SPxSense SVar3;
  int iVar4;
  Status SVar5;
  undefined8 uVar6;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar7;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  int i_1;
  Desc *ds;
  int i;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined4 in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffdd0;
  Status in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffddc;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffde0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffde8;
  undefined1 local_1e8 [80];
  undefined4 local_198;
  int local_194;
  Desc *local_190;
  DataKey local_184;
  SPxColId local_17c;
  DataKey local_174;
  DataKey local_16c;
  SPxColId local_164;
  undefined1 local_15c [80];
  DataKey local_10c;
  int local_104;
  undefined1 local_fd;
  allocator local_e9;
  string local_e8 [48];
  undefined4 *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  undefined1 *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  undefined1 *local_98;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  undefined4 *local_78;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_69;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_40;
  undefined1 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  bVar1 = isInitialized(in_RDI);
  if (bVar1) {
    RVar2 = rep(in_RDI);
    if (RVar2 == ROW) {
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::clear(in_stack_fffffffffffffde8);
      SVar3 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::spxSense(&in_RDI->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        );
      if (SVar3 == MINIMIZE) {
        local_104 = dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x4c8faa);
        while (local_104 = local_104 + -1, -1 < local_104) {
          local_10c = (DataKey)SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ::baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         *)CONCAT44(in_stack_fffffffffffffdcc,
                                                    in_stack_fffffffffffffdc8),0);
          bVar1 = SPxId::isSPxColId((SPxId *)&local_10c);
          if (bVar1) {
            fVec(in_RDI);
            local_28 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
            local_20 = local_15c;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_29,local_28);
            local_10 = local_15c;
            local_18 = local_28;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffdd0,
                       (cpp_dec_float<100U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
            local_8 = local_15c;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::negate
                      ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffdd0);
            local_16c = (DataKey)SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ::baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           *)CONCAT44(in_stack_fffffffffffffdcc,
                                                      in_stack_fffffffffffffdc8),0);
            SPxColId::SPxColId(&local_164,(SPxId *)&local_16c);
            SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::number(in_stack_fffffffffffffdd0,
                     (SPxColId *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
            local_90 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
            local_98 = local_15c;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                      ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffdd0,
                       (cpp_dec_float<100U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
          }
        }
      }
      else {
        local_104 = dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x4c9144);
        while (local_104 = local_104 + -1, -1 < local_104) {
          local_174 = (DataKey)SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ::baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         *)CONCAT44(in_stack_fffffffffffffdcc,
                                                    in_stack_fffffffffffffdc8),0);
          bVar1 = SPxId::isSPxColId((SPxId *)&local_174);
          if (bVar1) {
            fVec(in_RDI);
            pnVar7 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
            local_184 = (DataKey)SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ::baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           *)CONCAT44(in_stack_fffffffffffffdcc,
                                                      in_stack_fffffffffffffdc8),0);
            SPxColId::SPxColId(&local_17c,(SPxId *)&local_184);
            SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::number(in_stack_fffffffffffffdd0,
                     (SPxColId *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
            local_80 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
            local_88 = pnVar7;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                      ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffdd0,
                       (cpp_dec_float<100U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
          }
        }
      }
    }
    else {
      local_190 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::desc(&in_RDI->
                          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        );
      local_194 = 0;
      while (in_stack_fffffffffffffddc = local_194,
            iVar4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x4c9295), in_stack_fffffffffffffddc < iVar4) {
        in_stack_fffffffffffffdd8 =
             SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::Desc::colStatus((Desc *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
        if (((((uint)(in_stack_fffffffffffffdd8 + P_FREE) < 2) ||
             (in_stack_fffffffffffffdd8 == D_ON_LOWER)) || (in_stack_fffffffffffffdd8 == D_ON_BOTH))
           || (in_stack_fffffffffffffdd8 == D_UNDEFINED)) {
          local_198 = 0;
          local_b0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
          local_b8 = &local_198;
          local_78 = local_b8;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffdd0,
                     CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        }
        else {
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::maxObj((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x4c9357);
          in_stack_fffffffffffffdd0 =
               (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
          local_68 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
          local_58 = local_1e8;
          local_60 = in_stack_fffffffffffffdd0;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_69,
                     (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_fffffffffffffdd0,local_68);
          local_50 = local_1e8;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffdd0);
          local_38 = local_1e8;
          local_40 = local_60;
          local_48 = local_68;
          boost::multiprecision::default_ops::
          eval_subtract<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffdd0,
                     (cpp_dec_float<100U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                     (cpp_dec_float<100U,_int,_void> *)0x4c9429);
          local_a0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
          local_a8 = local_1e8;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffdd0,
                     (cpp_dec_float<100U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        }
        local_194 = local_194 + 1;
      }
      SVar3 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::spxSense(&in_RDI->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        );
      if (SVar3 == MINIMIZE) {
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
        ::operator*=(in_stack_fffffffffffffde0,
                     (double *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      }
    }
    SVar5 = status((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    return SVar5;
  }
  local_fd = 1;
  uVar6 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"XSOLVE09 No Problem loaded",&local_e9);
  SPxStatusException::SPxStatusException
            ((SPxStatusException *)in_stack_fffffffffffffdd0,
             (string *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  local_fd = 0;
  __cxa_throw(uVar6,&SPxStatusException::typeinfo,SPxStatusException::~SPxStatusException);
}

Assistant:

typename SPxSolverBase<R>::Status SPxSolverBase<R>::getRedCostSol(VectorBase<R>& p_vector) const
{

   assert(isInitialized());

   if(!isInitialized())
   {
      throw SPxStatusException("XSOLVE09 No Problem loaded");
      // return NOT_INIT;
   }

   if(rep() == ROW)
   {
      int i;
      p_vector.clear();

      if(this->spxSense() == SPxLPBase<R>::MINIMIZE)
      {
         for(i = dim() - 1; i >= 0; --i)
         {
            if(this->baseId(i).isSPxColId())
               p_vector[ this->number(SPxColId(this->baseId(i))) ] = -fVec()[i];
         }
      }
      else
      {
         for(i = dim() - 1; i >= 0; --i)
         {
            if(this->baseId(i).isSPxColId())
               p_vector[ this->number(SPxColId(this->baseId(i))) ] = fVec()[i];
         }
      }
   }
   else
   {
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

      for(int i = 0; i < this->nCols(); ++i)
      {
         switch(ds.colStatus(i))
         {
         case SPxBasisBase<R>::Desc::D_FREE:
         case SPxBasisBase<R>::Desc::D_ON_UPPER:
         case SPxBasisBase<R>::Desc::D_ON_LOWER:
         case SPxBasisBase<R>::Desc::D_ON_BOTH:
         case SPxBasisBase<R>::Desc::D_UNDEFINED:
            p_vector[i] = 0;
            break;

         default:
            p_vector[i] = this->maxObj()[i] - (*thePvec)[i];
         }
      }

      if(this->spxSense() == SPxLPBase<R>::MINIMIZE)
         p_vector *= -1.0;
   }

   return status();
}